

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O1

void __thiscall
ValidationSignals::TransactionRemovedFromMempool
          (ValidationSignals *this,CTransactionRef *tx,MemPoolRemovalReason reason,
          uint64_t mempool_sequence)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar2;
  bool bVar3;
  Logger *this_01;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  undefined8 *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *pcStack_e0;
  char *local_name;
  MemPoolRemovalReason reason_local;
  string local_c8;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  MemPoolRemovalReason local_98;
  undefined4 uStack_94;
  undefined8 uStack_90;
  ValidationSignals *local_88;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_name = "TransactionRemovedFromMempool";
  reason_local = reason;
  this_01 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(this_01,VALIDATION,Debug);
  if (bVar3) {
    base_blob<256u>::ToString_abi_cxx11_
              (&local_c8,
               &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_58,
               &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    RemovalReasonToString_abi_cxx11_(&local_78,&reason_local);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x67;
    logging_function._M_str = "TransactionRemovedFromMempool";
    logging_function._M_len = 0x1d;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0xd1,VALIDATION,Debug,
               (ConstevalFormatString<4U>)0xfd8d81,&local_name,&local_c8,&local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  local_c8._M_dataplus._M_p = local_name;
  local_c8._M_string_length =
       (size_type)(tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_c8.field_2._M_allocated_capacity =
       (size_type)
       (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.field_2._M_allocated_capacity)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c8.field_2._M_allocated_capacity)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.field_2._M_allocated_capacity)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c8.field_2._M_allocated_capacity)->_M_use_count + 1;
    }
  }
  local_c8.field_2._8_4_ = reason_local;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_f8 = (undefined8 *)0x0;
  uStack_f0 = 0;
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_a8 = peVar1;
  local_a0 = this_00;
  local_98 = reason;
  uStack_90 = mempool_sequence;
  local_88 = this;
  local_f8 = (undefined8 *)operator_new(0x48);
  *local_f8 = local_c8._M_dataplus._M_p;
  local_f8[1] = local_c8._M_string_length;
  local_f8[2] = local_c8.field_2._M_allocated_capacity;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_c8.field_2._M_allocated_capacity + 8) =
           *(_Atomic_word *)(local_c8.field_2._M_allocated_capacity + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_c8.field_2._M_allocated_capacity + 8) =
           *(_Atomic_word *)(local_c8.field_2._M_allocated_capacity + 8) + 1;
    }
  }
  *(undefined4 *)(local_f8 + 3) = local_c8.field_2._8_4_;
  local_f8[4] = local_a8;
  local_f8[5] = local_a0;
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_a0->_M_use_count = local_a0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_a0->_M_use_count = local_a0->_M_use_count + 1;
    }
  }
  local_f8[8] = local_88;
  *(MemPoolRemovalReason *)(local_f8 + 6) = local_98;
  *(undefined4 *)((long)local_f8 + 0x34) = uStack_94;
  *(undefined4 *)(local_f8 + 7) = (undefined4)uStack_90;
  *(undefined4 *)((long)local_f8 + 0x3c) = uStack_90._4_4_;
  pcStack_e0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:206:5)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:206:5)>
             ::_M_manager;
  (**(code **)(*(long *)uVar2._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar2._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_c8.field_2._M_allocated_capacity);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::TransactionRemovedFromMempool(const CTransactionRef& tx, MemPoolRemovalReason reason, uint64_t mempool_sequence) {
    auto event = [tx, reason, mempool_sequence, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.TransactionRemovedFromMempool(tx, reason, mempool_sequence); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: txid=%s wtxid=%s reason=%s", __func__,
                          tx->GetHash().ToString(),
                          tx->GetWitnessHash().ToString(),
                          RemovalReasonToString(reason));
}